

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

void __thiscall QtPrivate::QCalendarView::wheelEvent(QCalendarView *this,QWheelEvent *event)

{
  QCalendarModel *this_00;
  int iVar1;
  long in_FS_OFFSET;
  QDate currentDate;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 *puStack_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  undefined1 *local_50;
  void *local_48;
  undefined8 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (int)((ulong)((long)*(int *)(event + 0x5c) * 0x77777777) >> 0x20) - *(int *)(event + 0x5c)
  ;
  local_58.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QModelIndex *)&local_68,(QAbstractItemView *)this);
  this_00 = (QCalendarModel *)QAbstractItemView::model((QAbstractItemView *)this);
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = (undefined1 *)QCalendarModel::dateForCell(this_00,(int)local_68,local_68._4_4_);
  local_70 = (undefined1 *)
             QDate::addMonths(&local_70,(iVar1 >> 6) - (iVar1 >> 0x1f),
                              *(undefined8 *)&this_00->m_calendar);
  puStack_40 = &local_50;
  local_48 = (void *)0x0;
  local_50 = local_70;
  QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarView::wheelEvent(QWheelEvent *event)
{
    const int numDegrees = event->angleDelta().y() / 8;
    const int numSteps = numDegrees / 15;
    const QModelIndex index = currentIndex();
    QCalendarModel *calendarModel = static_cast<QCalendarModel*>(model());
    QDate currentDate = calendarModel->dateForCell(index.row(), index.column());
    currentDate = currentDate.addMonths(-numSteps, calendarModel->calendar());
    emit showDate(currentDate);
}